

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

EnumDescriptorProto * __thiscall
google::protobuf::EnumDescriptorProto::New(EnumDescriptorProto *this,Arena *arena)

{
  EnumDescriptorProto *this_00;
  EnumDescriptorProto *n;
  Arena *arena_local;
  EnumDescriptorProto *this_local;
  
  this_00 = (EnumDescriptorProto *)operator_new(0x40);
  EnumDescriptorProto(this_00);
  if (arena != (Arena *)0x0) {
    Arena::Own<google::protobuf::EnumDescriptorProto>(arena,this_00);
  }
  return this_00;
}

Assistant:

EnumDescriptorProto* EnumDescriptorProto::New(::google::protobuf::Arena* arena) const {
  EnumDescriptorProto* n = new EnumDescriptorProto;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}